

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O3

idx_t duckdb::TemplatedMatch<false,duckdb::interval_t,duckdb::LessThan>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  data_ptr_t pdVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  value_type vVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  unsigned_long *puVar7;
  long lVar8;
  const_reference pvVar9;
  long lVar10;
  idx_t iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  idx_t iVar16;
  idx_t iVar17;
  interval_t *lhs_data;
  bool bVar18;
  idx_t local_78;
  
  if ((lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pSVar2 = (lhs_format->unified).sel;
    pdVar1 = (lhs_format->unified).data;
    pdVar3 = rhs_row_locations->data;
    pvVar9 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar4 = *pvVar9;
      psVar5 = sel->sel_vector;
      psVar6 = pSVar2->sel_vector;
      local_78 = 0;
      iVar17 = 0;
      do {
        iVar16 = iVar17;
        if (psVar5 != (sel_t *)0x0) {
          iVar16 = (idx_t)psVar5[iVar17];
        }
        iVar11 = iVar16;
        if (psVar6 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar6[iVar16];
        }
        lVar8 = *(long *)(pdVar3 + iVar16 * 8);
        if ((1 << ((byte)col_idx & 7) & (uint)*(byte *)(lVar8 + (col_idx >> 3))) != 0) {
          lVar10 = *(long *)(lVar8 + vVar4);
          lVar8 = *(long *)(lVar8 + 8 + vVar4);
          lVar15 = iVar11 * 0x10;
          lVar13 = (lVar10 >> 0x20) + lVar8 / 86400000000;
          lVar12 = lVar13 % 0x1e;
          lVar14 = (long)(int)lVar10 + lVar13 / 0x1e;
          lVar13 = (long)*(int *)(pdVar1 + lVar15 + 4) +
                   *(long *)(pdVar1 + lVar15 + 8) / 86400000000;
          lVar10 = lVar13 % 0x1e;
          lVar13 = (long)*(int *)(pdVar1 + lVar15) + lVar13 / 0x1e;
          if ((lVar13 < lVar14) ||
             ((lVar13 <= lVar14 &&
              ((lVar10 < lVar12 ||
               ((lVar10 <= lVar12 &&
                (*(long *)(pdVar1 + lVar15 + 8) % 86400000000 < lVar8 % 86400000000)))))))) {
            psVar5[local_78] = (sel_t)iVar16;
            local_78 = local_78 + 1;
          }
        }
        iVar17 = iVar17 + 1;
      } while (count != iVar17);
      return local_78;
    }
  }
  else {
    pdVar1 = rhs_row_locations->data;
    pSVar2 = (lhs_format->unified).sel;
    pdVar3 = (lhs_format->unified).data;
    pvVar9 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar4 = *pvVar9;
      psVar5 = sel->sel_vector;
      psVar6 = pSVar2->sel_vector;
      puVar7 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      local_78 = 0;
      iVar17 = 0;
      do {
        iVar16 = iVar17;
        if (psVar5 != (sel_t *)0x0) {
          iVar16 = (idx_t)psVar5[iVar17];
        }
        iVar11 = iVar16;
        if (psVar6 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar6[iVar16];
        }
        if (puVar7 == (unsigned_long *)0x0) {
          bVar18 = false;
        }
        else {
          bVar18 = (puVar7[iVar11 >> 6] >> (iVar11 & 0x3f) & 1) == 0;
        }
        if ((!bVar18) &&
           (lVar8 = *(long *)(pdVar1 + iVar16 * 8),
           ((uint)*(byte *)(lVar8 + (col_idx >> 3)) & 1 << ((byte)col_idx & 7)) != 0)) {
          lVar10 = *(long *)(lVar8 + vVar4);
          lVar8 = *(long *)(lVar8 + 8 + vVar4);
          lVar12 = iVar11 * 0x10;
          lVar13 = (lVar10 >> 0x20) + lVar8 / 86400000000;
          lVar15 = lVar13 % 0x1e;
          lVar13 = (long)(int)lVar10 + lVar13 / 0x1e;
          lVar14 = (long)*(int *)(pdVar3 + lVar12 + 4) +
                   *(long *)(pdVar3 + lVar12 + 8) / 86400000000;
          lVar10 = lVar14 % 0x1e;
          lVar14 = (long)*(int *)(pdVar3 + lVar12) + lVar14 / 0x1e;
          if ((lVar14 < lVar13) ||
             ((lVar14 <= lVar13 &&
              ((lVar10 < lVar15 ||
               ((lVar10 <= lVar15 &&
                (*(long *)(pdVar3 + lVar12 + 8) % 86400000000 < lVar8 % 86400000000)))))))) {
            psVar5[local_78] = (sel_t)iVar16;
            local_78 = local_78 + 1;
          }
        }
        iVar17 = iVar17 + 1;
      } while (count != iVar17);
      return local_78;
    }
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}